

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

Vec_Int_t * Cba_NtkCollectOutFons(Cba_Ntk_t *p,Vec_Int_t *vObjs)

{
  int iVar1;
  Cba_ObjType_t CVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  Vec_Bit_t *p_02;
  int local_44;
  int local_40;
  int iFon;
  int iFin;
  int iObj;
  int k;
  int i;
  Vec_Bit_t *vVisFons;
  Vec_Bit_t *vMapObjs;
  Vec_Int_t *vFons;
  Vec_Int_t *vObjs_local;
  Cba_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Cba_NtkObjNum(p);
  p_01 = Vec_BitStart(iVar1 + 1);
  iVar1 = Cba_NtkFonNum(p);
  p_02 = Vec_BitStart(iVar1 + 1);
  for (iObj = 0; iVar1 = Vec_IntSize(vObjs), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vObjs,iObj);
    Vec_BitWriteEntry(p_01,iVar1,1);
  }
  for (iFon = 1; iVar1 = Vec_StrSize(&p->vObjType), iFon < iVar1; iFon = iFon + 1) {
    CVar2 = Cba_ObjType(p,iFon);
    if ((CVar2 != CBA_OBJ_NONE) && (iVar1 = Vec_BitEntry(p_01,iFon), iVar1 == 0)) {
      for (local_40 = Cba_ObjFin0(p,iFon); iVar1 = Cba_ObjFin0(p,iFon + 1), local_40 < iVar1;
          local_40 = local_40 + 1) {
        iVar1 = Cba_FinFon(p,local_40);
        if (0 < iVar1) {
          Vec_BitWriteEntry(p_02,iVar1,1);
        }
      }
    }
  }
  for (iObj = 0; iVar1 = Vec_IntSize(vObjs), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vObjs,iObj);
    for (local_44 = Cba_ObjFon0(p,iVar1); iVar3 = Cba_ObjFon0(p,iVar1 + 1), local_44 < iVar3;
        local_44 = local_44 + 1) {
      iVar3 = Vec_BitEntry(p_02,local_44);
      if (iVar3 != 0) {
        Vec_IntPush(p_00,local_44);
      }
    }
  }
  Vec_BitFree(p_01);
  Vec_BitFree(p_02);
  return p_00;
}

Assistant:

Vec_Int_t * Cba_NtkCollectOutFons( Cba_Ntk_t * p, Vec_Int_t * vObjs )
{
    Vec_Int_t * vFons = Vec_IntAlloc( 100 );
    Vec_Bit_t * vMapObjs = Vec_BitStart( Cba_NtkObjNum(p) + 1 );
    Vec_Bit_t * vVisFons = Vec_BitStart( Cba_NtkFonNum(p) + 1 );
    int i, k, iObj, iFin, iFon;
    // map objects
    Vec_IntForEachEntry( vObjs, iObj, i )
        Vec_BitWriteEntry( vMapObjs, iObj, 1 );
    // mark those used by non-objects
    Cba_NtkForEachObj( p, iObj )
        if ( !Vec_BitEntry(vMapObjs, iObj) )
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                if ( iFon > 0 )
                    Vec_BitWriteEntry( vVisFons, iFon, 1 );
    // collect pointed fons among those in objects
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFon( p, iObj, iFon, k )
            if ( Vec_BitEntry(vVisFons, iFon) )
                Vec_IntPush( vFons, iFon );
    Vec_BitFree( vMapObjs );
    Vec_BitFree( vVisFons );
    return vFons;
}